

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab11.c
# Opt level: O3

int FeedFromArray(void)

{
  int iVar1;
  TTestInOut *pTVar2;
  ulong uVar3;
  
  stream.In = (FILE *)fopen("in.txt","w+");
  if ((FILE *)stream.In == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    fprintf((FILE *)stream.In,"%lu %d\n",TestData.Tests[currentTest].CountItems,
            (ulong)(uint)TestData.Tests[currentTest].MaxKnapsackWeight);
    if (TestData.Tests[currentTest].CountItems != 0) {
      pTVar2 = &TestData;
      uVar3 = 0;
      do {
        fprintf((FILE *)stream.In,"%d %d\n",
                (ulong)(uint)((TKnapsackItem *)((long)pTVar2 + currentTest * 0x8f * 8))->Weight,
                (ulong)*(uint *)(currentTest * 0x478 + 0x10313c + uVar3 * 8));
        uVar3 = uVar3 + 1;
        pTVar2 = (TTestInOut *)((long)pTVar2 + 8);
      } while (uVar3 < TestData.Tests[currentTest].CountItems);
    }
    fclose((FILE *)stream.In);
  }
  return iVar1;
}

Assistant:

static int FeedFromArray(void) {
    stream.In = fopen("in.txt", "w+");
    if (!stream.In) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(stream.In, "%lu %d\n", TestData.Tests[currentTest].CountItems, TestData.Tests[currentTest].MaxKnapsackWeight);
    for (size_t i = 0; i < TestData.Tests[currentTest].CountItems; ++i) {
        fprintf(stream.In, "%d %d\n", TestData.Tests[currentTest].Items[i].Weight, TestData.Tests[currentTest].Items[i].Cost);
    }
    fclose(stream.In);
    return 0;
}